

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyalloc.c
# Opt level: O2

void tommy_allocator_init(tommy_allocator *alloc,tommy_size_t block_size,tommy_size_t align_size)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 8;
  if (8 < align_size) {
    uVar3 = align_size;
  }
  lVar2 = uVar3 - block_size % uVar3;
  if (block_size % uVar3 == 0) {
    lVar2 = 0;
  }
  alloc->block_size = lVar2 + block_size;
  alloc->align_size = uVar3;
  alloc->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    alloc->free_block = (tommy_allocator_entry_struct *)0x0;
    alloc->used_segment = (tommy_allocator_entry_struct *)0x0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_allocator_init(tommy_allocator* alloc, tommy_size_t block_size, tommy_size_t align_size)
{
	/* setup the minimal alignment */
	if (align_size < sizeof(void*))
		align_size = sizeof(void*);

	/* ensure that the block_size keeps the alignment */
	if (block_size % align_size != 0)
		block_size += align_size - block_size % align_size;

	alloc->block_size = block_size;
	alloc->align_size = align_size;

	alloc->count = 0;
	alloc->free_block = 0;
	alloc->used_segment = 0;
}